

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_property_double(nk_context *ctx,char *name,double min,double *val,double max,double step,
                       float inc_per_pixel)

{
  nk_property_variant local_38;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5cbc,
                  "void nk_property_double(struct nk_context *, const char *, double, double *, double, double, float)"
                 );
  }
  if (name != (char *)0x0) {
    if (val != (double *)0x0) {
      if (ctx->current != (nk_window *)0x0) {
        local_38.value.d = *val;
        local_38.kind = NK_PROPERTY_DOUBLE;
        local_38.min_value.d = min;
        local_38.max_value.d = max;
        local_38.step.d = step;
        nk_property(ctx,name,&local_38,inc_per_pixel,NK_FILTER_FLOAT);
        *val = (double)local_38.value;
      }
      return;
    }
    __assert_fail("val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5cbe,
                  "void nk_property_double(struct nk_context *, const char *, double, double *, double, double, float)"
                 );
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x5cbd,
                "void nk_property_double(struct nk_context *, const char *, double, double *, double, double, float)"
               );
}

Assistant:

NK_API void
nk_property_double(struct nk_context *ctx, const char *name,
    double min, double *val, double max, double step, float inc_per_pixel)
{
    struct nk_property_variant variant;
    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(val);

    if (!ctx || !ctx->current || !name || !val) return;
    variant = nk_property_variant_double(*val, min, max, step);
    nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_FLOAT);
    *val = variant.value.d;
}